

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_math_functions.h
# Opt level: O0

float dlib::impl::reciprocal<float>(float *val)

{
  float *val_local;
  undefined4 local_4;
  
  if ((*val != 0.0) || (NAN(*val))) {
    local_4 = 1.0 / *val;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

inline type reciprocal (const type& val)
        {
            // you can only compute reciprocal matrices that contain floats, doubles or long doubles.
            COMPILE_TIME_ASSERT((
                    is_same_type<type,float>::value == true || 
                    is_same_type<type,double>::value == true || 
                    is_same_type<type,long double>::value == true  ||
                    is_same_type<type,std::complex<float> >::value == true || 
                    is_same_type<type,std::complex<double> >::value == true || 
                    is_same_type<type,std::complex<long double> >::value == true 
            ));

            if (val != static_cast<type>(0))
                return static_cast<type>((type)1.0/val);
            else
                return 0;
        }